

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O0

void testOpenTiles(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *file;
  ostream *this;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  string fn;
  exr_context_t f;
  char *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  uint uVar5;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined8 local_b8;
  code *pcStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator<char> local_31;
  string local_30 [32];
  undefined1 local_10 [16];
  
  uVar5 = (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator(&local_31);
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  pcStack_b0 = err_cb;
  std::__cxx11::string::operator+=(local_30,"tiled.exr");
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_read(local_10,uVar2,&local_b8);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,uVar5,
                   in_stack_fffffffffffffed8);
  }
  exr_finish(local_10);
  std::__cxx11::string::operator=
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
            );
  std::__cxx11::string::operator+=(local_30,"v1.7.test.tiled.exr");
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_read(local_10,uVar2,&local_b8);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    file = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    this = std::operator<<(file,pcVar4);
    uVar5 = (uint)((ulong)pcVar4 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)poVar3,(char *)file,uVar5,(char *)this);
  }
  exr_finish(local_10);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testOpenTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}